

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_newton.c
# Opt level: O0

SUNNonlinearSolver SUNNonlinSol_NewtonSens(int count,N_Vector y)

{
  N_Vector y_00;
  SUNNonlinearSolver p_Var1;
  N_Vector w;
  SUNNonlinearSolver NLS;
  N_Vector y_local;
  int count_local;
  
  y_00 = N_VNew_SensWrapper(count,y);
  p_Var1 = SUNNonlinSol_Newton(y_00);
  N_VDestroy(y_00);
  return p_Var1;
}

Assistant:

SUNNonlinearSolver SUNNonlinSol_NewtonSens(int count, N_Vector y)
{
  SUNNonlinearSolver NLS;
  N_Vector w;

  /* create sensitivity vector wrapper */
  w = N_VNew_SensWrapper(count, y);

  /* create nonlinear solver using sensitivity vector wrapper */
  NLS = SUNNonlinSol_Newton(w);

  /* free sensitivity vector wrapper */
  N_VDestroy(w);

  /* return NLS object */
  return(NLS);
}